

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resize.c
# Opt level: O0

void av1_resize_and_extend_frame_c
               (YV12_BUFFER_CONFIG *src,YV12_BUFFER_CONFIG *dst,InterpFilter filter,int phase_scaler
               ,int num_planes)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  InterpKernel *paiVar7;
  long lVar8;
  long lVar9;
  uint uVar10;
  int in_ECX;
  byte in_DL;
  long in_RSI;
  long in_RDI;
  int in_R8D;
  int work_h;
  int work_w;
  uint8_t *dst_ptr;
  uint8_t *src_ptr;
  int x_q4;
  int x;
  int y_q4;
  int y;
  int dst_stride;
  uint8_t *dst_buffer;
  int dst_h;
  int dst_w;
  int src_stride;
  uint8_t *src_buffer;
  int src_h;
  int src_w;
  int is_uv;
  int i;
  InterpKernel *kernel;
  int in_stack_000020dc;
  InterpKernel *in_stack_000020e0;
  ptrdiff_t in_stack_000020e8;
  uint8_t *in_stack_000020f0;
  ptrdiff_t in_stack_000020f8;
  uint8_t *in_stack_00002100;
  int in_stack_00002110;
  int in_stack_00002118;
  int in_stack_00002120;
  int in_stack_00002128;
  int in_stack_00002130;
  int in_stack_fffffffffffffefc;
  uint in_stack_ffffffffffffff00;
  undefined4 in_stack_ffffffffffffff04;
  int local_c0;
  int local_bc;
  uint local_a8;
  uint local_a4;
  int local_a0;
  int local_78;
  int local_70;
  int local_3c;
  
  paiVar7 = (InterpKernel *)av1_interp_filter_params_list[in_DL].filter_ptr;
  local_3c = 0;
  while( true ) {
    local_a0 = in_R8D;
    if (2 < in_R8D) {
      local_a0 = 3;
    }
    if (local_a0 <= local_3c) break;
    uVar10 = (uint)(0 < local_3c);
    iVar1 = *(int *)(in_RDI + 0x10 + (long)(int)uVar10 * 4);
    iVar2 = *(int *)(in_RDI + 0x18 + (long)(int)uVar10 * 4);
    lVar8 = *(long *)(in_RDI + 0x28 + (long)local_3c * 8);
    iVar3 = *(int *)(in_RDI + 0x20 + (long)(int)uVar10 * 4);
    iVar4 = *(int *)(in_RSI + 0x10 + (long)(int)uVar10 * 4);
    iVar5 = *(int *)(in_RSI + 0x18 + (long)(int)uVar10 * 4);
    lVar9 = *(long *)(in_RSI + 0x28 + (long)local_3c * 8);
    iVar6 = *(int *)(in_RSI + 0x20 + (long)(int)uVar10 * 4);
    for (local_70 = 0; local_70 < iVar5; local_70 = local_70 + 0x10) {
      if (iVar2 == iVar5) {
        local_a4 = 0;
      }
      else {
        local_a4 = (local_70 * 0x10 * iVar2) / iVar5 + in_ECX;
      }
      for (local_78 = 0; local_78 < iVar4; local_78 = local_78 + 0x10) {
        if (iVar1 == iVar4) {
          local_a8 = 0;
        }
        else {
          local_a8 = (local_78 * 0x10 * iVar1) / iVar4 + in_ECX;
        }
        if (iVar4 - local_78 < 0x11) {
          local_bc = iVar4 - local_78;
        }
        else {
          local_bc = 0x10;
        }
        if (iVar5 - local_70 < 0x11) {
          local_c0 = iVar5 - local_70;
        }
        else {
          local_c0 = 0x10;
        }
        if ((local_bc == 0x10) && (local_c0 == 0x10)) {
          in_stack_ffffffffffffff00 = local_a4 & 0xf;
          (*aom_scaled_2d)((uint8_t *)
                           (lVar8 + ((local_70 * iVar2) / iVar5) * iVar3 +
                           (long)((local_78 * iVar1) / iVar4)),(long)iVar3,
                           (uint8_t *)(lVar9 + local_70 * iVar6 + (long)local_78),(long)iVar6,
                           paiVar7,local_a8 & 0xf,(iVar1 << 4) / iVar4,in_stack_ffffffffffffff00,
                           (iVar2 << 4) / iVar5,0x10,0x10);
        }
        else {
          in_stack_ffffffffffffff00 = local_a4 & 0xf;
          aom_scaled_2d_c(in_stack_00002100,in_stack_000020f8,in_stack_000020f0,in_stack_000020e8,
                          in_stack_000020e0,in_stack_000020dc,in_stack_00002110,in_stack_00002118,
                          in_stack_00002120,in_stack_00002128,in_stack_00002130);
        }
      }
    }
    local_3c = local_3c + 1;
  }
  aom_extend_frame_borders_c
            ((YV12_BUFFER_CONFIG *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
             in_stack_fffffffffffffefc);
  return;
}

Assistant:

void av1_resize_and_extend_frame_c(const YV12_BUFFER_CONFIG *src,
                                   YV12_BUFFER_CONFIG *dst,
                                   const InterpFilter filter,
                                   const int phase_scaler,
                                   const int num_planes) {
  assert(filter == BILINEAR || filter == EIGHTTAP_SMOOTH ||
         filter == EIGHTTAP_REGULAR);
  const InterpKernel *const kernel =
      (const InterpKernel *)av1_interp_filter_params_list[filter].filter_ptr;

  for (int i = 0; i < AOMMIN(num_planes, MAX_MB_PLANE); ++i) {
    const int is_uv = i > 0;
    const int src_w = src->crop_widths[is_uv];
    const int src_h = src->crop_heights[is_uv];
    const uint8_t *src_buffer = src->buffers[i];
    const int src_stride = src->strides[is_uv];
    const int dst_w = dst->crop_widths[is_uv];
    const int dst_h = dst->crop_heights[is_uv];
    uint8_t *dst_buffer = dst->buffers[i];
    const int dst_stride = dst->strides[is_uv];
    for (int y = 0; y < dst_h; y += 16) {
      const int y_q4 =
          src_h == dst_h ? 0 : y * 16 * src_h / dst_h + phase_scaler;
      for (int x = 0; x < dst_w; x += 16) {
        const int x_q4 =
            src_w == dst_w ? 0 : x * 16 * src_w / dst_w + phase_scaler;
        const uint8_t *src_ptr =
            src_buffer + y * src_h / dst_h * src_stride + x * src_w / dst_w;
        uint8_t *dst_ptr = dst_buffer + y * dst_stride + x;

        // Width and height of the actual working area.
        const int work_w = AOMMIN(16, dst_w - x);
        const int work_h = AOMMIN(16, dst_h - y);
        // SIMD versions of aom_scaled_2d() have some trouble handling
        // nonstandard sizes, so fall back on the C version to handle borders.
        if (work_w != 16 || work_h != 16) {
          aom_scaled_2d_c(src_ptr, src_stride, dst_ptr, dst_stride, kernel,
                          x_q4 & 0xf, 16 * src_w / dst_w, y_q4 & 0xf,
                          16 * src_h / dst_h, work_w, work_h);
        } else {
          aom_scaled_2d(src_ptr, src_stride, dst_ptr, dst_stride, kernel,
                        x_q4 & 0xf, 16 * src_w / dst_w, y_q4 & 0xf,
                        16 * src_h / dst_h, 16, 16);
        }
      }
    }
  }
  aom_extend_frame_borders(dst, num_planes);
}